

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sprite.cpp
# Opt level: O0

void __thiscall sf::Sprite::Sprite(Sprite *this,Texture *texture,IntRect *rectangle)

{
  Vertex *local_40;
  IntRect *rectangle_local;
  Texture *texture_local;
  Sprite *this_local;
  
  Drawable::Drawable(&this->super_Drawable);
  Transformable::Transformable(&this->super_Transformable);
  (this->super_Drawable)._vptr_Drawable = (_func_int **)&PTR__Sprite_003331c0;
  (this->super_Transformable)._vptr_Transformable = (_func_int **)&PTR__Sprite_003331e8;
  local_40 = (Vertex *)&(this->super_Transformable).field_0xac;
  do {
    Vertex::Vertex(local_40);
    local_40 = local_40 + 1;
  } while (local_40 != (Vertex *)&this->field_0x104);
  this->m_texture = (Texture *)0x0;
  Rect<int>::Rect(&this->m_textureRect);
  setTexture(this,texture,false);
  setTextureRect(this,rectangle);
  return;
}

Assistant:

Sprite::Sprite(const Texture& texture, const IntRect& rectangle) :
m_texture    (NULL),
m_textureRect()
{
    setTexture(texture);
    setTextureRect(rectangle);
}